

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d8.cpp
# Opt level: O2

void rw::d3d8::defaultUninstanceCB(Geometry *geo,InstanceData *inst)

{
  uint uVar1;
  uint8 *src;
  int32 i;
  uint8 *src_00;
  long lVar2;
  
  src = d3d::lockVertices(inst->vertexBuffer,0,0,0);
  uninstV3d(8,geo->morphTargets->vertices + inst->minVert,src,inst->numVertices,inst->stride);
  src_00 = src + 0xc;
  uVar1 = geo->flags;
  if ((uVar1 & 0x10) != 0) {
    uninstV3d(8,geo->morphTargets->normals + inst->minVert,src_00,inst->numVertices,inst->stride);
    src_00 = src + 0x18;
    uVar1 = geo->flags;
  }
  inst->vertexAlpha = '\0';
  if ((uVar1 & 8) != 0) {
    uninstColor(10,geo->colors + inst->minVert,src_00,inst->numVertices,inst->stride);
    src_00 = src_00 + 4;
  }
  for (lVar2 = 0; lVar2 < geo->numTexCoordSets; lVar2 = lVar2 + 1) {
    uninstTexCoords(7,geo->texCoords[lVar2] + inst->minVert,src_00,inst->numVertices,inst->stride);
    src_00 = src_00 + 8;
  }
  d3d::unlockVertices(inst->vertexBuffer);
  return;
}

Assistant:

void
defaultUninstanceCB(Geometry *geo, InstanceData *inst)
{
	uint8 *src = lockVertices(inst->vertexBuffer, 0, 0, D3DLOCK_NOSYSLOCK);
	uninstV3d(VERT_FLOAT3,
		&geo->morphTargets[0].vertices[inst->minVert],
		src, inst->numVertices, inst->stride);
	src += 12;

	if(geo->flags & Geometry::NORMALS){
		uninstV3d(VERT_FLOAT3,
		          &geo->morphTargets[0].normals[inst->minVert],
		          src, inst->numVertices, inst->stride);
		src += 12;
	}

	inst->vertexAlpha = 0;
	if(geo->flags & Geometry::PRELIT){
		uninstColor(VERT_ARGB, &geo->colors[inst->minVert], src,
		            inst->numVertices, inst->stride);
		src += 4;
	}

	for(int32 i = 0; i < geo->numTexCoordSets; i++){
		uninstTexCoords(VERT_FLOAT2, &geo->texCoords[i][inst->minVert], src,
		          inst->numVertices, inst->stride);
		src += 8;
	}
	unlockVertices(inst->vertexBuffer);
}